

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string *input,FieldDescriptor *field,Message *output)

{
  undefined1 uVar1;
  uint uVar2;
  TokenType TVar3;
  uint uVar4;
  long in_RDI;
  uint uVar5;
  ParserImpl parser;
  ArrayInputStream input_stream;
  undefined4 local_1e8;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe39;
  undefined1 in_stack_fffffffffffffe3a;
  undefined1 in_stack_fffffffffffffe3b;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  TokenType in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe5c;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  SingularOverwritePolicy in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffee0;
  
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (void *)CONCAT17(in_stack_fffffffffffffe3f,
                              CONCAT16(in_stack_fffffffffffffe3e,
                                       CONCAT15(in_stack_fffffffffffffe3d,
                                                CONCAT14(in_stack_fffffffffffffe3c,
                                                         CONCAT13(in_stack_fffffffffffffe3b,
                                                                  CONCAT12(in_stack_fffffffffffffe3a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe39,
                                                  in_stack_fffffffffffffe38))))))),
             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  Message::GetDescriptor((Message *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  uVar5 = *(byte *)(in_RDI + 0x18) & 1;
  uVar4 = *(byte *)(in_RDI + 0x1e) & 1;
  TVar3 = *(byte *)(in_RDI + 0x1d) & TYPE_END;
  uVar2 = *(byte *)(in_RDI + 0x19) & 1;
  local_1e8 = 0;
  ParserImpl::ParserImpl
            ((ParserImpl *)&local_1e8,
             (Descriptor *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (ZeroCopyInputStream *)
             CONCAT44(in_stack_fffffffffffffe5c,*(undefined4 *)(in_RDI + 0x20)),
             (ErrorCollector *)
             (CONCAT44(in_stack_fffffffffffffe54,(uint)*(byte *)(in_RDI + 0x18)) &
             0xffffffff00000001),
             (Finder *)
             (CONCAT44(in_stack_fffffffffffffe4c,(uint)*(byte *)(in_RDI + 0x1e)) &
             0xffffffff00000001),
             (ParseInfoTree *)
             (CONCAT44(in_stack_fffffffffffffe44,(uint)*(byte *)(in_RDI + 0x1d)) &
             0xffffffff00000001),in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe3f,
             (bool)in_stack_fffffffffffffe3e,(bool)in_stack_fffffffffffffe3d,
             (bool)in_stack_fffffffffffffe3c,false,false,false,in_stack_fffffffffffffee0);
  uVar1 = ParserImpl::ParseField
                    ((ParserImpl *)CONCAT44(in_stack_fffffffffffffe54,uVar5),
                     (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffe4c,uVar4),
                     (Message *)CONCAT44(in_stack_fffffffffffffe44,TVar3));
  ParserImpl::~ParserImpl((ParserImpl *)CONCAT44(in_stack_fffffffffffffe24,uVar2));
  io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)0x433034);
  return (bool)(uVar1 & 1);
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(const std::string& input,
                                                   const FieldDescriptor* field,
                                                   Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(
      output->GetDescriptor(), &input_stream, error_collector_, finder_,
      parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
      allow_case_insensitive_field_, allow_unknown_field_,
      allow_unknown_extension_, allow_unknown_enum_, allow_field_number_,
      allow_relaxed_whitespace_, allow_partial_, recursion_limit_);
  return parser.ParseField(field, output);
}